

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
::int_writer<long_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::num_writer::operator()
          (num_writer *this,char8_t **it)

{
  int iVar1;
  char8_t *__dest;
  ulong uVar2;
  undefined1 *puVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ptrdiff_t _Num;
  size_t __n;
  bool bVar13;
  char_type buffer [26];
  undefined1 local_58 [40];
  
  __dest = *it;
  uVar4 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  __n = (size_t)iVar1;
  puVar3 = local_58 + __n;
  if (uVar4 < 100) {
    bVar13 = false;
  }
  else {
    iVar8 = -1;
    uVar10 = 1;
    iVar11 = -2;
    uVar12 = 2;
    uVar7 = uVar4;
    do {
      uVar4 = uVar7 / 100;
      uVar2 = (ulong)(uint)(((int)uVar7 + (int)uVar4 * -100) * 2);
      puVar3[-1] = internal::basic_data<void>::DIGITS[uVar2 + 1];
      lVar5 = -1;
      if ((int)(uVar10 / 3) * 3 + iVar8 == 0) {
        *(num_writer *)(puVar3 + -2) = this[0xc];
        lVar5 = -2;
      }
      puVar3[lVar5 + -1] = internal::basic_data<void>::DIGITS[uVar2];
      if ((uVar12 / 3) * 3 + iVar11 == 0) {
        *(num_writer *)(puVar3 + lVar5 + -2) = this[0xc];
        lVar5 = lVar5 + -2;
      }
      else {
        lVar5 = lVar5 + -1;
      }
      puVar3 = puVar3 + lVar5;
      iVar8 = iVar8 + -2;
      uVar9 = (int)uVar10 + 2;
      uVar10 = (ulong)uVar9;
      iVar11 = iVar11 + -2;
      uVar12 = uVar12 + 2;
      bVar13 = 9999 < uVar7;
      uVar7 = uVar4;
    } while (bVar13);
    bVar13 = iVar8 + (uVar9 / 3) * 3 == 0;
  }
  if (uVar4 < 10) {
    bVar6 = (byte)uVar4 | 0x30;
  }
  else {
    puVar3[-1] = internal::basic_data<void>::DIGITS[(uVar4 * 2 & 0xffffffff) + 1];
    lVar5 = -1;
    if (bVar13) {
      *(num_writer *)(puVar3 + -2) = this[0xc];
      lVar5 = -2;
    }
    puVar3 = puVar3 + lVar5;
    bVar6 = internal::basic_data<void>::DIGITS[uVar4 * 2 & 0x1fffffffe];
  }
  puVar3[-1] = bVar6;
  if (iVar1 != 0) {
    memcpy(__dest,local_58,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }